

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::
apply(Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *__return_storage_ptr__,
     Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
     *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *pMVar3;
  ParserInput subInput;
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> _subResult425;
  Results results;
  ParserInput local_c8;
  Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *local_a0;
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_98;
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_78;
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_58;
  
  local_58.endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_58.ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_58.pos = (RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_a0 = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) {
LAB_0012dba0:
      Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::releaseAsArray
                ((Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&local_c8,
                 (Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&local_58);
      pMVar3 = local_a0;
      (local_a0->ptr).isSet = true;
      (local_a0->ptr).field_1.value.ptr =
           (Array<capnp::Orphan<capnp::compiler::Token>_> *)
           local_c8.super_IteratorInput<char,_const_char_*>.parent;
      (local_a0->ptr).field_1.value.size_ =
           (size_t)local_c8.super_IteratorInput<char,_const_char_*>.pos;
      (local_a0->ptr).field_1.value.disposer =
           (ArrayDisposer *)local_c8.super_IteratorInput<char,_const_char_*>.end;
      local_c8.super_IteratorInput<char,_const_char_*>.parent =
           (IteratorInput<char,_const_char_*> *)0x0;
      local_c8.super_IteratorInput<char,_const_char_*>.pos = (char *)0x0;
      Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~Array
                ((Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&local_c8);
      ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::dispose(&local_58);
      return pMVar3;
    }
    local_c8.begin = input->begin;
    local_c8.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_c8.super_IteratorInput<char,_const_char_*>.pos = (char *)pAVar1;
    local_c8.super_IteratorInput<char,_const_char_*>.end = (char *)pAVar2;
    local_c8.super_IteratorInput<char,_const_char_*>.best = (char *)pAVar1;
    Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>
              ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&local_78,subParser,
               &local_c8);
    local_98.isSet = local_78.isSet;
    if (local_78.isSet == true) {
      local_98.field_1.value.ptr = local_78.field_1.value.ptr;
      local_98.field_1.value.size_ = local_78.field_1.value.size_;
      local_98.field_1.value.disposer = local_78.field_1.value.disposer;
      local_78.field_1.value.ptr = (Orphan<capnp::compiler::Token> *)0x0;
      local_78.field_1.value.size_ = 0;
    }
    kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~NullableValue
              (&local_78);
    if (local_98.isSet != true) {
      kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~NullableValue
                (&local_98);
      IteratorInput<char,_const_char_*>::~IteratorInput
                (&local_c8.super_IteratorInput<char,_const_char_*>);
      goto LAB_0012dba0;
    }
    ((IteratorInput<char,_const_char_*> *)
    &(local_c8.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
         local_c8.super_IteratorInput<char,_const_char_*>.pos;
    Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>>>::
    add<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
              ((Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>>> *)&local_58,
               &local_98.field_1.value);
    kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~NullableValue
              (&local_98);
    IteratorInput<char,_const_char_*>::~IteratorInput
              (&local_c8.super_IteratorInput<char,_const_char_*>);
  } while( true );
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }